

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dh_exch.c
# Opt level: O0

int dh_set_ctx_params(void *vpdhctx,OSSL_PARAM *params)

{
  int iVar1;
  EVP_MD *pEVar2;
  char *pcVar3;
  long in_RSI;
  undefined8 *in_RDI;
  size_t tmp_ukmlen;
  void *tmp_ukm;
  size_t outlen;
  char mdprops [80];
  char *str;
  char name [80];
  uint pad;
  OSSL_PARAM *p;
  PROV_DH_CTX *pdhctx;
  size_t *in_stack_fffffffffffffef8;
  EVP_MD *in_stack_ffffffffffffff00;
  void **in_stack_ffffffffffffff08;
  OSSL_LIB_CTX *in_stack_ffffffffffffff10;
  OSSL_PARAM *in_stack_ffffffffffffff18;
  char local_88 [92];
  int local_2c;
  OSSL_PARAM *local_28;
  undefined8 *local_20;
  long local_18;
  int local_4;
  
  local_20 = in_RDI;
  local_18 = in_RSI;
  memset(local_88,0,0x50);
  if (local_20 == (undefined8 *)0x0) {
    local_4 = 0;
  }
  else if (local_18 == 0) {
    local_4 = 1;
  }
  else {
    local_28 = OSSL_PARAM_locate_const
                         ((OSSL_PARAM *)in_stack_ffffffffffffff00,(char *)in_stack_fffffffffffffef8)
    ;
    if (local_28 != (OSSL_PARAM *)0x0) {
      iVar1 = OSSL_PARAM_get_utf8_string
                        (in_stack_ffffffffffffff18,(char **)in_stack_ffffffffffffff10,
                         (size_t)in_stack_ffffffffffffff08);
      if (iVar1 == 0) {
        return 0;
      }
      if (local_88[0] == '\0') {
        *(undefined4 *)((long)local_20 + 0x1c) = 0;
      }
      else {
        iVar1 = strcmp(local_88,"X942KDF-ASN1");
        if (iVar1 != 0) {
          return 0;
        }
        *(undefined4 *)((long)local_20 + 0x1c) = 1;
      }
    }
    local_28 = OSSL_PARAM_locate_const
                         ((OSSL_PARAM *)in_stack_ffffffffffffff00,(char *)in_stack_fffffffffffffef8)
    ;
    if (local_28 != (OSSL_PARAM *)0x0) {
      memset(&stack0xffffffffffffff18,0,0x50);
      iVar1 = OSSL_PARAM_get_utf8_string
                        (in_stack_ffffffffffffff18,(char **)in_stack_ffffffffffffff10,
                         (size_t)in_stack_ffffffffffffff08);
      if (iVar1 == 0) {
        return 0;
      }
      local_28 = OSSL_PARAM_locate_const
                           ((OSSL_PARAM *)in_stack_ffffffffffffff00,
                            (char *)in_stack_fffffffffffffef8);
      if ((local_28 != (OSSL_PARAM *)0x0) &&
         (iVar1 = OSSL_PARAM_get_utf8_string
                            (in_stack_ffffffffffffff18,(char **)in_stack_ffffffffffffff10,
                             (size_t)in_stack_ffffffffffffff08), iVar1 == 0)) {
        return 0;
      }
      EVP_MD_free(in_stack_ffffffffffffff00);
      pEVar2 = EVP_MD_fetch(in_stack_ffffffffffffff10,(char *)in_stack_ffffffffffffff08,
                            (char *)in_stack_ffffffffffffff00);
      local_20[4] = pEVar2;
      iVar1 = ossl_digest_is_allowed((OSSL_LIB_CTX *)*local_20,(EVP_MD *)local_20[4]);
      if (iVar1 == 0) {
        EVP_MD_free(in_stack_ffffffffffffff00);
        local_20[4] = 0;
      }
      if (local_20[4] == 0) {
        return 0;
      }
    }
    local_28 = OSSL_PARAM_locate_const
                         ((OSSL_PARAM *)in_stack_ffffffffffffff00,(char *)in_stack_fffffffffffffef8)
    ;
    if (local_28 != (OSSL_PARAM *)0x0) {
      iVar1 = OSSL_PARAM_get_size_t
                        ((OSSL_PARAM *)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
      if (iVar1 == 0) {
        return 0;
      }
      local_20[7] = in_stack_ffffffffffffff10;
    }
    local_28 = OSSL_PARAM_locate_const
                         ((OSSL_PARAM *)in_stack_ffffffffffffff00,(char *)in_stack_fffffffffffffef8)
    ;
    if (local_28 != (OSSL_PARAM *)0x0) {
      in_stack_ffffffffffffff08 = (void **)0x0;
      CRYPTO_free((void *)local_20[5]);
      local_20[5] = 0;
      local_20[6] = 0;
      if ((local_28->data != (void *)0x0) && (local_28->data_size != 0)) {
        iVar1 = OSSL_PARAM_get_octet_string
                          ((OSSL_PARAM *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
                           (size_t)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
        if (iVar1 == 0) {
          return 0;
        }
        local_20[5] = in_stack_ffffffffffffff08;
        local_20[6] = in_stack_ffffffffffffff00;
      }
    }
    local_28 = OSSL_PARAM_locate_const
                         ((OSSL_PARAM *)in_stack_ffffffffffffff00,(char *)in_stack_fffffffffffffef8)
    ;
    if (local_28 != (OSSL_PARAM *)0x0) {
      iVar1 = OSSL_PARAM_get_uint((OSSL_PARAM *)in_stack_ffffffffffffff00,
                                  (uint *)in_stack_fffffffffffffef8);
      if (iVar1 == 0) {
        return 0;
      }
      *(byte *)(local_20 + 3) = *(byte *)(local_20 + 3) & 0xfe | local_2c != 0;
    }
    local_28 = OSSL_PARAM_locate_const
                         ((OSSL_PARAM *)in_stack_ffffffffffffff00,(char *)in_stack_fffffffffffffef8)
    ;
    if (local_28 != (OSSL_PARAM *)0x0) {
      iVar1 = OSSL_PARAM_get_utf8_string
                        (in_stack_ffffffffffffff18,(char **)in_stack_ffffffffffffff10,
                         (size_t)in_stack_ffffffffffffff08);
      if (iVar1 == 0) {
        return 0;
      }
      pcVar3 = CRYPTO_strdup(local_88,"providers/implementations/exchange/dh_exch.c",0x18a);
      local_20[8] = pcVar3;
    }
    local_4 = 1;
  }
  return local_4;
}

Assistant:

static int dh_set_ctx_params(void *vpdhctx, const OSSL_PARAM params[])
{
    PROV_DH_CTX *pdhctx = (PROV_DH_CTX *)vpdhctx;
    const OSSL_PARAM *p;
    unsigned int pad;
    char name[80] = { '\0' }; /* should be big enough */
    char *str = NULL;

    if (pdhctx == NULL)
        return 0;
    if (params == NULL)
        return 1;

    p = OSSL_PARAM_locate_const(params, OSSL_EXCHANGE_PARAM_KDF_TYPE);
    if (p != NULL) {
        str = name;
        if (!OSSL_PARAM_get_utf8_string(p, &str, sizeof(name)))
            return 0;

        if (name[0] == '\0')
            pdhctx->kdf_type = PROV_DH_KDF_NONE;
        else if (strcmp(name, OSSL_KDF_NAME_X942KDF_ASN1) == 0)
            pdhctx->kdf_type = PROV_DH_KDF_X9_42_ASN1;
        else
            return 0;
    }
    p = OSSL_PARAM_locate_const(params, OSSL_EXCHANGE_PARAM_KDF_DIGEST);
    if (p != NULL) {
        char mdprops[80] = { '\0' }; /* should be big enough */

        str = name;
        if (!OSSL_PARAM_get_utf8_string(p, &str, sizeof(name)))
            return 0;

        str = mdprops;
        p = OSSL_PARAM_locate_const(params,
                                    OSSL_EXCHANGE_PARAM_KDF_DIGEST_PROPS);

        if (p != NULL) {
            if (!OSSL_PARAM_get_utf8_string(p, &str, sizeof(mdprops)))
                return 0;
        }

        EVP_MD_free(pdhctx->kdf_md);
        pdhctx->kdf_md = EVP_MD_fetch(pdhctx->libctx, name, mdprops);
        if (!ossl_digest_is_allowed(pdhctx->libctx, pdhctx->kdf_md)) {
            EVP_MD_free(pdhctx->kdf_md);
            pdhctx->kdf_md = NULL;
        }
        if (pdhctx->kdf_md == NULL)
            return 0;
    }

    p = OSSL_PARAM_locate_const(params, OSSL_EXCHANGE_PARAM_KDF_OUTLEN);
    if (p != NULL) {
        size_t outlen;

        if (!OSSL_PARAM_get_size_t(p, &outlen))
            return 0;
        pdhctx->kdf_outlen = outlen;
    }

    p = OSSL_PARAM_locate_const(params, OSSL_EXCHANGE_PARAM_KDF_UKM);
    if (p != NULL) {
        void *tmp_ukm = NULL;
        size_t tmp_ukmlen;

        OPENSSL_free(pdhctx->kdf_ukm);
        pdhctx->kdf_ukm = NULL;
        pdhctx->kdf_ukmlen = 0;
        /* ukm is an optional field so it can be NULL */
        if (p->data != NULL && p->data_size != 0) {
            if (!OSSL_PARAM_get_octet_string(p, &tmp_ukm, 0, &tmp_ukmlen))
                return 0;
            pdhctx->kdf_ukm = tmp_ukm;
            pdhctx->kdf_ukmlen = tmp_ukmlen;
        }
    }

    p = OSSL_PARAM_locate_const(params, OSSL_EXCHANGE_PARAM_PAD);
    if (p != NULL) {
        if (!OSSL_PARAM_get_uint(p, &pad))
            return 0;
        pdhctx->pad = pad ? 1 : 0;
    }

    p = OSSL_PARAM_locate_const(params, OSSL_KDF_PARAM_CEK_ALG);
    if (p != NULL) {
        str = name;
        if (!OSSL_PARAM_get_utf8_string(p, &str, sizeof(name)))
            return 0;
        pdhctx->kdf_cekalg = OPENSSL_strdup(name);
    }
    return 1;
}